

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::
moveFromSpan(Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *this,
            Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *fromSpan,
            size_t fromIndex,size_t to)

{
  byte bVar1;
  byte bVar2;
  Entry *pEVar3;
  uchar uVar4;
  Entry *pEVar5;
  
  uVar4 = this->nextFree;
  if (uVar4 == this->allocated) {
    addStorage(this);
    uVar4 = this->nextFree;
  }
  this->offsets[to] = uVar4;
  pEVar3 = this->entries;
  bVar1 = this->nextFree;
  this->nextFree = pEVar3[bVar1].storage.data[0];
  bVar2 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar5 = fromSpan->entries;
  Node<unsigned_long_long,_QSslServerPrivate::SocketData>::Node
            ((Node<unsigned_long_long,_QSslServerPrivate::SocketData> *)(pEVar3 + bVar1),
             (Node<unsigned_long_long,_QSslServerPrivate::SocketData> *)(pEVar5 + bVar2));
  pEVar5 = pEVar5 + bVar2;
  QSslServerPrivate::SocketData::~SocketData((SocketData *)((pEVar5->storage).data + 8));
  (pEVar5->storage).data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar2;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }